

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O1

uint8_t * svb_insert_scalar_d1_init
                    (uint8_t *keyPtr,uint8_t *dataPtr,size_t dataSize,uint32_t count,uint32_t prev,
                    uint32_t new_key,uint32_t *position)

{
  undefined1 (*pauVar1) [64];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  sbyte sVar9;
  byte bVar10;
  ushort uVar11;
  ulong uVar12;
  int iVar13;
  uint8_t *in_RAX;
  long lVar14;
  uint *puVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  byte bVar19;
  int iVar20;
  bool bVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  uint local_5c;
  uint local_58;
  uint local_54;
  uint8_t *local_50;
  undefined1 (*local_48) [64];
  uint local_40;
  uint local_3c;
  undefined1 (*local_38) [64];
  
  local_5c = new_key;
  if (count == 0) {
    *position = 0;
    local_50 = (uint8_t *)dataSize;
    in_RAX = svb_encode_scalar_d1_init(&local_5c,keyPtr,dataPtr,1,prev);
  }
  else {
    uVar17 = (uint)*keyPtr;
    local_50 = dataPtr + dataSize;
    bVar21 = true;
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar32 = vpbroadcastq_avx512f(ZEXT816(0x4080000000000000));
    vpbroadcastq_avx512f(ZEXT816(0x10204081020));
    local_40 = 0;
    local_54 = 0;
    puVar15 = (uint *)dataPtr;
    local_38 = (undefined1 (*) [64])dataPtr;
    do {
      local_48 = (undefined1 (*) [64])keyPtr;
      if ((char)local_40 == '\b') {
        uVar17 = (uint)(byte)(*(undefined1 (*) [64])keyPtr)[1];
        local_48 = (undefined1 (*) [64])(*(undefined1 (*) [64])keyPtr + 1);
        local_40 = 0;
      }
      uVar16 = uVar17 >> (local_40 & 0x1f);
      switch(uVar16 & 3) {
      case 0:
        local_58 = (uint)(byte)*puVar15;
        lVar14 = 1;
        break;
      case 1:
        local_58 = (uint)(ushort)*puVar15;
        lVar14 = 2;
        break;
      case 2:
        local_58 = (uint)(uint3)*puVar15;
        lVar14 = 3;
        break;
      case 3:
        local_58 = *puVar15;
        lVar14 = 4;
      }
      local_58 = local_58 + prev;
      local_3c = local_5c;
      bVar19 = (byte)local_40;
      if (local_58 < local_5c) {
        puVar15 = (uint *)((long)puVar15 + lVar14);
        local_40 = (uint)(byte)(bVar19 + 2);
        prev = local_58;
      }
      else {
        sVar9 = (bVar19 < 0x21) * (' ' - bVar19);
        uVar17 = (-1 << (local_40 & 0x1f) & uVar17) << 2 | (uVar17 << sVar9) >> sVar9;
        pauVar1 = (undefined1 (*) [64])(*local_48 + 1);
        if (pauVar1 < dataPtr) {
          auVar33 = vpbroadcastb_avx512bw();
          auVar34 = vpbroadcastq_avx512f();
          auVar35 = vpbroadcastq_avx512f();
          auVar24 = vporq_avx512f(auVar35,auVar24);
          auVar25 = vporq_avx512f(auVar35,auVar25);
          auVar26 = vporq_avx512f(auVar35,auVar26);
          auVar27 = vporq_avx512f(auVar35,auVar27);
          auVar28 = vporq_avx512f(auVar35,auVar28);
          auVar29 = vporq_avx512f(auVar35,auVar29);
          auVar30 = vporq_avx512f(auVar35,auVar30);
          auVar31 = vporq_avx512f(auVar35,auVar31);
          uVar2 = vpcmpuq_avx512f(auVar31,auVar34,2);
          uVar3 = vpcmpuq_avx512f(auVar30,auVar34,2);
          uVar4 = vpcmpuq_avx512f(auVar29,auVar34,2);
          uVar5 = vpcmpuq_avx512f(auVar28,auVar34,2);
          uVar6 = vpcmpuq_avx512f(auVar27,auVar34,2);
          uVar7 = vpcmpuq_avx512f(auVar26,auVar34,2);
          uVar23 = vpcmpuq_avx512f(auVar25,auVar34,2);
          uVar8 = vpcmpuq_avx512f(auVar24,auVar34,2);
          bVar19 = (byte)uVar8;
          uVar22 = (ulong)CONCAT11((char)uVar7,(char)uVar6);
          do {
            bVar10 = (byte)uVar23;
            uVar11 = CONCAT11(bVar19,bVar10);
            uVar23 = (ulong)uVar11;
            uVar17 = CONCAT22(uVar11,(short)uVar22);
            uVar12 = CONCAT44(uVar17,CONCAT22(CONCAT11((byte)uVar5,(byte)uVar4),
                                              CONCAT11((byte)uVar3,(byte)uVar2)));
            auVar31 = vmovdqu8_avx512bw(*pauVar1);
            auVar30[1] = ((byte)(uVar12 >> 1) & 1) * auVar31[1];
            auVar30[0] = ((byte)uVar2 & 1) * auVar31[0];
            auVar30[2] = ((byte)(uVar12 >> 2) & 1) * auVar31[2];
            auVar30[3] = ((byte)(uVar12 >> 3) & 1) * auVar31[3];
            auVar30[4] = ((byte)(uVar12 >> 4) & 1) * auVar31[4];
            auVar30[5] = ((byte)(uVar12 >> 5) & 1) * auVar31[5];
            auVar30[6] = ((byte)(uVar12 >> 6) & 1) * auVar31[6];
            auVar30[7] = ((byte)(uVar12 >> 7) & 1) * auVar31[7];
            auVar30[8] = ((byte)uVar3 & 1) * auVar31[8];
            auVar30[9] = ((byte)(uVar12 >> 9) & 1) * auVar31[9];
            auVar30[10] = ((byte)(uVar12 >> 10) & 1) * auVar31[10];
            auVar30[0xb] = ((byte)(uVar12 >> 0xb) & 1) * auVar31[0xb];
            auVar30[0xc] = ((byte)(uVar12 >> 0xc) & 1) * auVar31[0xc];
            auVar30[0xd] = ((byte)(uVar12 >> 0xd) & 1) * auVar31[0xd];
            auVar30[0xe] = ((byte)(uVar12 >> 0xe) & 1) * auVar31[0xe];
            auVar30[0xf] = ((byte)(uVar12 >> 0xf) & 1) * auVar31[0xf];
            auVar30[0x10] = ((byte)uVar4 & 1) * auVar31[0x10];
            auVar30[0x11] = ((byte)(uVar12 >> 0x11) & 1) * auVar31[0x11];
            auVar30[0x12] = ((byte)(uVar12 >> 0x12) & 1) * auVar31[0x12];
            auVar30[0x13] = ((byte)(uVar12 >> 0x13) & 1) * auVar31[0x13];
            auVar30[0x14] = ((byte)(uVar12 >> 0x14) & 1) * auVar31[0x14];
            auVar30[0x15] = ((byte)(uVar12 >> 0x15) & 1) * auVar31[0x15];
            auVar30[0x16] = ((byte)(uVar12 >> 0x16) & 1) * auVar31[0x16];
            auVar30[0x17] = ((byte)(uVar12 >> 0x17) & 1) * auVar31[0x17];
            auVar30[0x18] = ((byte)uVar5 & 1) * auVar31[0x18];
            auVar30[0x19] = ((byte)(uVar12 >> 0x19) & 1) * auVar31[0x19];
            auVar30[0x1a] = ((byte)(uVar12 >> 0x1a) & 1) * auVar31[0x1a];
            auVar30[0x1b] = ((byte)(uVar12 >> 0x1b) & 1) * auVar31[0x1b];
            auVar30[0x1c] = ((byte)(uVar12 >> 0x1c) & 1) * auVar31[0x1c];
            auVar30[0x1d] = ((byte)(uVar12 >> 0x1d) & 1) * auVar31[0x1d];
            auVar30[0x1e] = ((byte)(uVar12 >> 0x1e) & 1) * auVar31[0x1e];
            auVar30[0x1f] = ((byte)(uVar12 >> 0x1f) & 1) * auVar31[0x1f];
            auVar30[0x20] = ((byte)uVar22 & 1) * auVar31[0x20];
            auVar30[0x21] = ((byte)(uVar17 >> 1) & 1) * auVar31[0x21];
            auVar30[0x22] = ((byte)(uVar17 >> 2) & 1) * auVar31[0x22];
            auVar30[0x23] = ((byte)(uVar17 >> 3) & 1) * auVar31[0x23];
            auVar30[0x24] = ((byte)(uVar17 >> 4) & 1) * auVar31[0x24];
            auVar30[0x25] = ((byte)(uVar17 >> 5) & 1) * auVar31[0x25];
            auVar30[0x26] = ((byte)(uVar17 >> 6) & 1) * auVar31[0x26];
            auVar30[0x27] = ((byte)(uVar17 >> 7) & 1) * auVar31[0x27];
            auVar30[0x28] = ((byte)(uVar22 >> 8) & 1) * auVar31[0x28];
            auVar30[0x29] = ((byte)(uVar17 >> 9) & 1) * auVar31[0x29];
            auVar30[0x2a] = ((byte)(uVar17 >> 10) & 1) * auVar31[0x2a];
            auVar30[0x2b] = ((byte)(uVar17 >> 0xb) & 1) * auVar31[0x2b];
            auVar30[0x2c] = ((byte)(uVar17 >> 0xc) & 1) * auVar31[0x2c];
            auVar30[0x2d] = ((byte)(uVar17 >> 0xd) & 1) * auVar31[0x2d];
            auVar30[0x2e] = ((byte)(uVar17 >> 0xe) & 1) * auVar31[0x2e];
            auVar30[0x2f] = ((byte)(uVar17 >> 0xf) & 1) * auVar31[0x2f];
            auVar30[0x30] = (bVar10 & 1) * auVar31[0x30];
            auVar30[0x31] = ((byte)(uVar11 >> 1) & 1) * auVar31[0x31];
            auVar30[0x32] = ((byte)(uVar11 >> 2) & 1) * auVar31[0x32];
            auVar30[0x33] = ((byte)(uVar11 >> 3) & 1) * auVar31[0x33];
            auVar30[0x34] = ((byte)(uVar11 >> 4) & 1) * auVar31[0x34];
            auVar30[0x35] = ((byte)(uVar11 >> 5) & 1) * auVar31[0x35];
            auVar30[0x36] = ((byte)(uVar11 >> 6) & 1) * auVar31[0x36];
            auVar30[0x37] = ((byte)(uVar11 >> 7) & 1) * auVar31[0x37];
            auVar30[0x38] = (bVar19 & 1) * auVar31[0x38];
            auVar30[0x39] = (bVar19 >> 1 & 1) * auVar31[0x39];
            auVar30[0x3a] = (bVar19 >> 2 & 1) * auVar31[0x3a];
            auVar30[0x3b] = (bVar19 >> 3 & 1) * auVar31[0x3b];
            auVar30[0x3c] = (bVar19 >> 4 & 1) * auVar31[0x3c];
            auVar30[0x3d] = (bVar19 >> 5 & 1) * auVar31[0x3d];
            auVar30[0x3e] = (bVar19 >> 6 & 1) * auVar31[0x3e];
            auVar30[0x3f] = -((char)bVar19 >> 7) * auVar31[0x3f];
            auVar31 = vgf2p8affineqb_avx512f(auVar30,auVar32,0);
            auVar30 = valignq_avx512f(auVar31,auVar33,6);
            auVar33 = vpalignr_avx512bw(auVar31,auVar30);
            in(0);
            uVar22 = uVar12;
          } while( true );
        }
        uVar18 = local_5c - prev;
        iVar13 = 1;
        iVar20 = 1;
        if ((0xff < uVar18) && (iVar20 = 2, 0xffff < uVar18)) {
          iVar20 = 4 - (uint)(uVar18 < 0x1000000);
        }
        uVar18 = local_58 - local_5c;
        if ((0xff < uVar18) && (iVar13 = 2, 0xffff < uVar18)) {
          iVar13 = 4 - (uint)(uVar18 < 0x1000000);
        }
        iVar20 = iVar20 + (~uVar16 | 0xfffffffc);
        uVar16 = iVar20 + iVar13;
        if (uVar16 != 0 && SCARRY4(iVar20,iVar13) == (int)uVar16 < 0) {
          memmove((byte *)((ulong)uVar16 + (long)puVar15),puVar15,(long)local_50 - (long)puVar15);
          vpbroadcastq_avx512f(ZEXT816(0x10204081020));
          auVar32 = vpbroadcastq_avx512f(ZEXT816(0x4080000000000000));
          auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar29 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
          auVar28 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
          auVar27 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
          auVar26 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
          auVar25 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
          auVar24 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
          dataPtr = (uint8_t *)local_38;
        }
        uVar18 = local_5c - prev;
        if (uVar18 < 0x100) {
          *(byte *)puVar15 = (byte)uVar18;
          iVar13 = 0;
          lVar14 = 1;
        }
        else if (uVar18 < 0x10000) {
          *(ushort *)puVar15 = (ushort)uVar18;
          iVar13 = 1;
          lVar14 = 2;
        }
        else if (uVar18 < 0x1000000) {
          *(ushort *)puVar15 = (ushort)uVar18;
          *(byte *)((long)puVar15 + 2) = (byte)(uVar18 >> 0x10);
          iVar13 = 2;
          lVar14 = 3;
        }
        else {
          *puVar15 = uVar18;
          iVar13 = 3;
          lVar14 = 4;
        }
        puVar15 = (uint *)((long)puVar15 + lVar14);
        (*local_48)[0] = (byte)(iVar13 << (local_40 & 0x1f)) | (byte)uVar17;
        bVar19 = (char)local_40 + 2;
        local_40 = (uint)bVar19;
        if (bVar19 == 8) {
          local_40 = 0;
          local_48 = pauVar1;
        }
        uVar18 = local_58 - local_5c;
        if (uVar18 < 0x100) {
          *(byte *)puVar15 = (byte)uVar18;
          iVar13 = 0;
          lVar14 = 1;
        }
        else if (uVar18 < 0x10000) {
          *(short *)puVar15 = (short)uVar18;
          iVar13 = 1;
          lVar14 = 2;
        }
        else if (uVar18 < 0x1000000) {
          *(short *)puVar15 = (short)uVar18;
          *(byte *)((long)puVar15 + 2) = (byte)(uVar18 >> 0x10);
          iVar13 = 2;
          lVar14 = 3;
        }
        else {
          *puVar15 = uVar18;
          iVar13 = 3;
          lVar14 = 4;
        }
        puVar15 = (uint *)((long)puVar15 + lVar14);
        (*local_48)[0] =
             (byte)(iVar13 << (local_40 & 0x1f)) | ~(byte)(3 << (local_40 & 0x1f)) & (*local_48)[0];
        *position = local_54;
        in_RAX = local_50 + (int)uVar16;
      }
      if (local_3c <= local_58) break;
      local_54 = local_54 + 1;
      bVar21 = local_54 < count;
      keyPtr = (uint8_t *)local_48;
    } while (local_54 != count);
    if (!bVar21) {
      bVar21 = (char)local_40 == '\b';
      if (bVar21) {
        local_40 = 0;
      }
      uVar16 = local_5c - prev;
      if (uVar16 < 0x100) {
        *(byte *)puVar15 = (byte)uVar16;
        bVar19 = 0;
      }
      else if (uVar16 < 0x10000) {
        *(ushort *)puVar15 = (ushort)uVar16;
        bVar19 = 1;
      }
      else if (uVar16 < 0x1000000) {
        *(ushort *)puVar15 = (ushort)uVar16;
        *(byte *)((long)puVar15 + 2) = (byte)(uVar16 >> 0x10);
        bVar19 = 2;
      }
      else {
        *puVar15 = uVar16;
        bVar19 = 3;
      }
      (*local_48)[bVar21] =
           bVar19 << (local_40 & 0x1f) | ~(byte)(3 << (local_40 & 0x1f)) & (byte)uVar17;
      *position = count;
      in_RAX = local_50 + (ulong)bVar19 + 1;
    }
  }
  return in_RAX;
}

Assistant:

uint8_t *svb_insert_scalar_d1_init(uint8_t *keyPtr, uint8_t *dataPtr,
                                   size_t dataSize, uint32_t count,
                                   uint32_t prev, uint32_t new_key,
                                   uint32_t *position) {
  if (count == 0) {
    *position = 0;
    return svb_encode_scalar_d1_init(&new_key, keyPtr, dataPtr, 1, prev);
  }

  uint8_t shift = 0;
  uint32_t key = *keyPtr;
  uint8_t *dataPtrBegin = dataPtr;

  for (uint32_t c = 0; c < count; c++) {
    uint8_t *dataPtrPrev = dataPtr;

    if (shift == 8) {
      shift = 0;
      key = *(++keyPtr);
    }

    uint8_t current_key_code = (key >> shift) & 0x3;
    uint32_t current_key = prev + _decode_data(&dataPtr, current_key_code);
    if (current_key >= new_key) {
      // rewind to the insertion position
      dataPtr = dataPtrPrev;

      // shift keys 2 bits "to the right"
      uint32_t mask_hi = key & (~0u << shift);
      uint32_t mask_lo = key & ((1 << shift) - 1);
      key = (mask_hi << 2) | mask_lo;
      uint32_t carry_bits, prev_carry_bits = (key & (3 << 8)) >> 8;

      for (uint8_t *p = keyPtr + 1; p < dataPtrBegin; p++) {
        carry_bits = (*p & (3 << 6)) >> 6;
        *p <<= 2;
        *p |= prev_carry_bits;
        prev_carry_bits = carry_bits;
      }

      // shift values n bytes "to the right", then insert the new key
      // and the updated delta of the next key
      int gap = _encoded_length(new_key - prev) +
                _encoded_length(current_key - new_key) - (current_key_code + 1);
      assert(gap >= 0);
      if (gap > 0)
        memmove(dataPtr + gap, dataPtr, dataSize - (dataPtr - dataPtrBegin));

      // first insert the new key
      uint8_t code = _encode_data(new_key - prev, &dataPtr);
      *keyPtr = (uint8_t)(key | (code << shift));

      // then update the current key
      shift += 2;
      if (shift == 8) {
        shift = 0;
        keyPtr++;
      }
      code = _encode_data(current_key - new_key, &dataPtr);
      *keyPtr &= ~(3 << shift);
      *keyPtr |= (code << shift);

      *position = c;
      return dataPtrBegin + dataSize + gap;
    }

    prev = current_key;
    shift += 2;
  }

  // append the new key at the end
  if (shift == 8) {
    shift = 0;
    keyPtr++;
  }

  uint8_t code = _encode_data(new_key - prev, &dataPtr);
  key &= ~(3 << shift);
  key |= code << shift;
  *keyPtr = (uint8_t)(key); // write last key (no increment needed)

  *position = count;
  return dataPtrBegin + dataSize + code + 1;
}